

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int cm_zlib_inflateCopy(z_streamp dest,z_streamp source)

{
  ct_data_s *pcVar1;
  internal_state *__src;
  long lVar2;
  undefined1 *puVar3;
  int iVar4;
  internal_state *__dest;
  voidpf __dest_00;
  int iVar5;
  
  iVar4 = inflateStateCheck(source);
  iVar5 = -2;
  if ((dest != (z_streamp)0x0) && (iVar4 == 0)) {
    __src = source->state;
    __dest = (internal_state *)(*source->zalloc)(source->opaque,1,0x1bf8);
    iVar5 = -4;
    if (__dest != (internal_state *)0x0) {
      lVar2._0_1_ = __src->method;
      lVar2._1_3_ = *(undefined3 *)&__src->field_0x49;
      lVar2._4_4_ = __src->last_flush;
      if (lVar2 == 0) {
        __dest_00 = (void *)0x0;
      }
      else {
        __dest_00 = (*source->zalloc)(source->opaque,1 << (*(byte *)&__src->gzhead & 0x1f),1);
        if (__dest_00 == (voidpf)0x0) {
          (*source->zfree)(source->opaque,__dest);
          return -4;
        }
      }
      memcpy(dest,source,0x70);
      memcpy(__dest,__src,0x1bf8);
      __dest->strm = dest;
      puVar3 = (undefined1 *)__src->window_size;
      pcVar1 = __src->dyn_ltree + 0x121;
      if (puVar3 <= __src[1].dyn_ltree + 0xf4 && pcVar1 <= puVar3) {
        __dest->window_size = (ulg)(puVar3 + (0x558 - (long)pcVar1) + (long)&__dest->strm);
        __dest->prev = (Posf *)((long)__dest + (long)__src->prev + (0x558 - (long)pcVar1));
      }
      *(long *)&__dest->hash_shift =
           (long)__dest + (*(long *)&__src->hash_shift - (long)pcVar1) + 0x558;
      if (__dest_00 != (void *)0x0) {
        memcpy(__dest_00,*(void **)&__src->method,1L << (*(byte *)&__src->gzhead & 0x3f));
      }
      *(voidpf *)&__dest->method = __dest_00;
      dest->state = __dest;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int ZEXPORT inflateCopy(z_streamp dest, z_streamp source) {
    struct inflate_state FAR *state;
    struct inflate_state FAR *copy;
    unsigned char FAR *window;
    unsigned wsize;

    /* check input */
    if (inflateStateCheck(source) || dest == Z_NULL)
        return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)source->state;

    /* allocate space */
    copy = (struct inflate_state FAR *)
           ZALLOC(source, 1, sizeof(struct inflate_state));
    if (copy == Z_NULL) return Z_MEM_ERROR;
    window = Z_NULL;
    if (state->window != Z_NULL) {
        window = (unsigned char FAR *)
                 ZALLOC(source, 1U << state->wbits, sizeof(unsigned char));
        if (window == Z_NULL) {
            ZFREE(source, copy);
            return Z_MEM_ERROR;
        }
    }

    /* copy state */
    zmemcpy((voidpf)dest, (voidpf)source, sizeof(z_stream));
    zmemcpy((voidpf)copy, (voidpf)state, sizeof(struct inflate_state));
    copy->strm = dest;
    if (state->lencode >= state->codes &&
        state->lencode <= state->codes + ENOUGH - 1) {
        copy->lencode = copy->codes + (state->lencode - state->codes);
        copy->distcode = copy->codes + (state->distcode - state->codes);
    }
    copy->next = copy->codes + (state->next - state->codes);
    if (window != Z_NULL) {
        wsize = 1U << state->wbits;
        zmemcpy(window, state->window, wsize);
    }
    copy->window = window;
    dest->state = (struct internal_state FAR *)copy;
    return Z_OK;
}